

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

DecompressResult
tcu::astc::anon_unknown_0::setTexelColors
          (void *dst,ColorEndpointPair *colorEndpoints,TexelWeightPair *texelWeights,int ccs,
          deUint32 partitionIndexSeed,int numPartitions,int blockWidth,int blockHeight,bool isSRGB,
          bool isLDRMode,deUint32 *colorEndpointModes)

{
  uint uVar1;
  bool bVar2;
  deFloat16 v;
  int iVar3;
  uint uVar4;
  deUint32 dVar5;
  deUint32 dVar6;
  ColorEndpointPair *this;
  UVec4 *this_00;
  uint *puVar7;
  float fVar8;
  uint local_d4;
  uint local_d0;
  float local_cc;
  uint local_c8;
  uint local_c0;
  int local_b8;
  deFloat16 cf;
  deUint32 mt;
  deUint32 m;
  deUint32 e;
  deUint32 c_1;
  deUint32 w_1;
  deUint32 c1_1;
  deUint32 c0_1;
  deUint32 c;
  deUint32 w;
  deUint32 c1;
  deUint32 c0;
  int channelNdx;
  TexelWeightPair *weight;
  UVec4 *e1;
  UVec4 *e0;
  int colorEndpointNdx;
  int texelNdx;
  int texelX;
  int texelY;
  int i;
  bool isHDREndpoint [4];
  DecompressResult result;
  bool smallBlock;
  bool isLDRMode_local;
  bool isSRGB_local;
  int numPartitions_local;
  deUint32 partitionIndexSeed_local;
  int ccs_local;
  TexelWeightPair *texelWeights_local;
  ColorEndpointPair *colorEndpoints_local;
  void *dst_local;
  
  isHDREndpoint[3] = isSRGB;
  isHDREndpoint[2] = isLDRMode;
  isHDREndpoint[1] = blockWidth * blockHeight < 0x1f;
  i = 0;
  for (texelX = 0; texelX < numPartitions; texelX = texelX + 1) {
    bVar2 = isColorEndpointModeHDR(colorEndpointModes[texelX]);
    *(bool *)((long)&texelY + (long)texelX) = bVar2;
  }
  for (texelNdx = 0; texelNdx < blockHeight; texelNdx = texelNdx + 1) {
    for (colorEndpointNdx = 0; colorEndpointNdx < blockWidth;
        colorEndpointNdx = colorEndpointNdx + 1) {
      iVar3 = texelNdx * blockWidth + colorEndpointNdx;
      if (numPartitions == 1) {
        local_b8 = 0;
      }
      else {
        local_b8 = computeTexelPartition
                             (partitionIndexSeed,colorEndpointNdx,texelNdx,0,numPartitions,
                              (bool)(isHDREndpoint[1] & 1));
      }
      this = colorEndpoints + local_b8;
      this_00 = &colorEndpoints[local_b8].e1;
      if (((isHDREndpoint[2] & 1U) == 0) || ((*(byte *)((long)&texelY + (long)local_b8) & 1) == 0))
      {
        for (c1 = 0; (int)c1 < 4; c1 = c1 + 1) {
          if (((*(byte *)((long)&texelY + (long)local_b8) & 1) == 0) ||
             ((c1 == 3 && (colorEndpointModes[local_b8] == 0xe)))) {
            puVar7 = Vector<unsigned_int,_4>::operator[](&this->e0,c1);
            uVar4 = *puVar7;
            if ((isHDREndpoint[3] & 1U) == 0) {
              puVar7 = Vector<unsigned_int,_4>::operator[](&this->e0,c1);
              local_c0 = *puVar7;
            }
            else {
              local_c0 = 0x80;
            }
            puVar7 = Vector<unsigned_int,_4>::operator[](this_00,c1);
            uVar1 = *puVar7;
            if ((isHDREndpoint[3] & 1U) == 0) {
              puVar7 = Vector<unsigned_int,_4>::operator[](this_00,c1);
              local_c8 = *puVar7;
            }
            else {
              local_c8 = 0x80;
            }
            uVar4 = (uVar4 << 8 | local_c0) * (0x40 - texelWeights[iVar3].w[(int)(uint)(ccs == c1)])
                    + (uVar1 << 8 | local_c8) * texelWeights[iVar3].w[(int)(uint)(ccs == c1)] + 0x20
                    >> 6;
            if ((isHDREndpoint[3] & 1U) == 0) {
              if (uVar4 == 0xffff) {
                local_cc = 1.0;
              }
              else {
                local_cc = (float)uVar4 / 65536.0;
              }
              *(float *)((long)dst + (long)(int)(iVar3 * 4 + c1) * 4) = local_cc;
            }
            else {
              *(char *)((long)dst + (long)(int)(iVar3 * 4 + c1)) = (char)(uVar4 >> 8);
            }
          }
          else {
            puVar7 = Vector<unsigned_int,_4>::operator[](&this->e0,c1);
            uVar4 = *puVar7;
            puVar7 = Vector<unsigned_int,_4>::operator[](this_00,c1);
            uVar4 = uVar4 * 0x10 * (0x40 - texelWeights[iVar3].w[(int)(uint)(ccs == c1)]) +
                    *puVar7 * 0x10 * texelWeights[iVar3].w[(int)(uint)(ccs == c1)] + 0x20 >> 6;
            dVar5 = getBits(uVar4,0xb,0xf);
            dVar6 = getBits(uVar4,0,10);
            if (dVar6 < 0x200) {
              local_d0 = dVar6 * 3;
            }
            else {
              if (dVar6 < 0x600) {
                local_d4 = dVar6 * 4 - 0x200;
              }
              else {
                local_d4 = dVar6 * 5 - 0x800;
              }
              local_d0 = local_d4;
            }
            v = (short)(dVar5 << 10) + (short)(local_d0 >> 3);
            bVar2 = isFloat16InfOrNan(v);
            if (bVar2) {
              v = 0x7bff;
            }
            fVar8 = deFloat16To32(v);
            *(float *)((long)dst + (long)(int)(iVar3 * 4 + c1) * 4) = fVar8;
          }
        }
      }
      else {
        if ((isHDREndpoint[3] & 1U) == 0) {
          *(undefined4 *)((long)dst + (long)(iVar3 * 4) * 4) = 0x3f800000;
          *(undefined4 *)((long)dst + (long)(iVar3 * 4 + 1) * 4) = 0;
          *(undefined4 *)((long)dst + (long)(iVar3 * 4 + 2) * 4) = 0x3f800000;
          *(undefined4 *)((long)dst + (long)(iVar3 * 4 + 3) * 4) = 0x3f800000;
        }
        else {
          *(undefined1 *)((long)dst + (long)(iVar3 * 4)) = 0xff;
          *(undefined1 *)((long)dst + (long)(iVar3 * 4 + 1)) = 0;
          *(undefined1 *)((long)dst + (long)(iVar3 * 4 + 2)) = 0xff;
          *(undefined1 *)((long)dst + (long)(iVar3 * 4 + 3)) = 0xff;
        }
        i = 1;
      }
    }
  }
  return i;
}

Assistant:

DecompressResult setTexelColors (void* dst, ColorEndpointPair* colorEndpoints, TexelWeightPair* texelWeights, int ccs, deUint32 partitionIndexSeed,
								 int numPartitions, int blockWidth, int blockHeight, bool isSRGB, bool isLDRMode, const deUint32* colorEndpointModes)
{
	const bool			smallBlock	= blockWidth*blockHeight < 31;
	DecompressResult	result		= DECOMPRESS_RESULT_VALID_BLOCK;
	bool				isHDREndpoint[4];

	for (int i = 0; i < numPartitions; i++)
		isHDREndpoint[i] = isColorEndpointModeHDR(colorEndpointModes[i]);

	for (int texelY = 0; texelY < blockHeight; texelY++)
	for (int texelX = 0; texelX < blockWidth; texelX++)
	{
		const int				texelNdx			= texelY*blockWidth + texelX;
		const int				colorEndpointNdx	= numPartitions == 1 ? 0 : computeTexelPartition(partitionIndexSeed, texelX, texelY, 0, numPartitions, smallBlock);
		DE_ASSERT(colorEndpointNdx < numPartitions);
		const UVec4&			e0					= colorEndpoints[colorEndpointNdx].e0;
		const UVec4&			e1					= colorEndpoints[colorEndpointNdx].e1;
		const TexelWeightPair&	weight				= texelWeights[texelNdx];

		if (isLDRMode && isHDREndpoint[colorEndpointNdx])
		{
			if (isSRGB)
			{
				((deUint8*)dst)[texelNdx*4 + 0] = 0xff;
				((deUint8*)dst)[texelNdx*4 + 1] = 0;
				((deUint8*)dst)[texelNdx*4 + 2] = 0xff;
				((deUint8*)dst)[texelNdx*4 + 3] = 0xff;
			}
			else
			{
				((float*)dst)[texelNdx*4 + 0] = 1.0f;
				((float*)dst)[texelNdx*4 + 1] = 0;
				((float*)dst)[texelNdx*4 + 2] = 1.0f;
				((float*)dst)[texelNdx*4 + 3] = 1.0f;
			}

			result = DECOMPRESS_RESULT_ERROR;
		}
		else
		{
			for (int channelNdx = 0; channelNdx < 4; channelNdx++)
			{
				if (!isHDREndpoint[colorEndpointNdx] || (channelNdx == 3 && colorEndpointModes[colorEndpointNdx] == 14)) // \note Alpha for mode 14 is treated the same as LDR.
				{
					const deUint32 c0	= (e0[channelNdx] << 8) | (isSRGB ? 0x80 : e0[channelNdx]);
					const deUint32 c1	= (e1[channelNdx] << 8) | (isSRGB ? 0x80 : e1[channelNdx]);
					const deUint32 w	= weight.w[ccs == channelNdx ? 1 : 0];
					const deUint32 c	= (c0*(64-w) + c1*w + 32) / 64;

					if (isSRGB)
						((deUint8*)dst)[texelNdx*4 + channelNdx] = (deUint8)((c & 0xff00) >> 8);
					else
						((float*)dst)[texelNdx*4 + channelNdx] = c == 65535 ? 1.0f : (float)c / 65536.0f;
				}
				else
				{
					DE_STATIC_ASSERT((de::meta::TypesSame<deFloat16, deUint16>::Value));
					const deUint32		c0	= e0[channelNdx] << 4;
					const deUint32		c1	= e1[channelNdx] << 4;
					const deUint32		w	= weight.w[ccs == channelNdx ? 1 : 0];
					const deUint32		c	= (c0*(64-w) + c1*w + 32) / 64;
					const deUint32		e	= getBits(c, 11, 15);
					const deUint32		m	= getBits(c, 0, 10);
					const deUint32		mt	= m < 512		? 3*m
											: m >= 1536		? 5*m - 2048
											:				  4*m - 512;
					const deFloat16		cf	= (deFloat16)((e << 10) + (mt >> 3));

					((float*)dst)[texelNdx*4 + channelNdx] = deFloat16To32(isFloat16InfOrNan(cf) ? 0x7bff : cf);
				}
			}
		}
	}

	return result;
}